

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O0

Orphan<capnp::List<capnp::schema::Annotation,_(capnp::Kind)3>_> * __thiscall
capnp::compiler::NodeTranslator::compileAnnotationApplications
          (Orphan<capnp::List<capnp::schema::Annotation,_(capnp::Kind)3>_> *__return_storage_ptr__,
          NodeTranslator *this,Reader annotations,StringPtr targetsFlagName)

{
  ErrorReporter *pEVar1;
  Resolver *pRVar2;
  Reader source;
  Reader type;
  Reader source_00;
  Reader name_00;
  Reader name_01;
  Reader name_02;
  Reader name_03;
  Builder target;
  Reader type_00;
  ImplicitParams implicitMethodParams;
  Builder target_00;
  ReaderFor<bool> RVar3;
  bool bVar4;
  Which WVar5;
  uint uVar6;
  NullableValue<capnp::compiler::NodeTranslator::BrandedDecl> *other;
  BrandedDecl *pBVar7;
  NullableValue<capnp::compiler::Declaration::Which> *other_00;
  Which *pWVar8;
  uint64_t uVar9;
  NullableValue<capnp::Schema> *other_01;
  Schema *pSVar10;
  Reader *value_00;
  char (*in_R8) [49];
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  StructDataBitCount SVar17;
  undefined4 uVar18;
  undefined8 uVar19;
  String local_770;
  String local_758;
  ArrayPtr<const_char> local_740;
  RawBrandedSchema *local_730;
  Builder local_728;
  Reader local_700;
  Reader local_6d0;
  Builder local_6a0;
  Reader local_678;
  undefined8 local_648;
  String local_618;
  String local_600;
  ArrayPtr<const_char> local_5e8;
  Builder local_5d0;
  Reader local_5a8;
  undefined1 local_578 [8];
  Reader value;
  String local_518;
  String local_500;
  ArrayPtr<const_char> local_4e8;
  char *local_4d8;
  size_t sStack_4d0;
  ReaderFor<DynamicTypeFor<FromReader<Reader_&>_>_>_conflict local_4c8;
  Reader local_490;
  Reader local_448;
  undefined1 local_418 [8];
  Reader node;
  Reader local_3c0;
  Maybe<capnp::Schema> local_390;
  undefined1 local_380 [8];
  NullableValue<capnp::Schema> annotationSchema;
  String local_338;
  String local_320;
  ArrayPtr<const_char> local_308;
  undefined1 local_2f8 [4];
  NullableValue<capnp::compiler::Declaration::Which> local_2f4;
  undefined1 auStack_2f0 [4];
  NullableValue<capnp::compiler::Declaration::Which> kind;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 local_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  Maybe<capnp::compiler::NodeTranslator::BrandedDecl> local_280;
  undefined1 local_1d0 [8];
  NullableValue<capnp::compiler::NodeTranslator::BrandedDecl> decl;
  Reader name;
  Builder local_e8;
  undefined1 local_c0 [8];
  Builder annotationBuilder;
  Reader annotation;
  uint i;
  undefined1 local_58 [8];
  BuilderFor<capnp::List<capnp::schema::Annotation,_(capnp::Kind)3>_> builder;
  NodeTranslator *this_local;
  StringPtr targetsFlagName_local;
  Orphan<capnp::List<capnp::schema::Annotation,_(capnp::Kind)3>_> *result;
  
  uVar6 = List<capnp::compiler::Declaration::AnnotationApplication,_(capnp::Kind)3>::Reader::size
                    (&annotations);
  if ((uVar6 == 0) || ((this->compileAnnotations & 1U) == 0)) {
    memset(__return_storage_ptr__,0,0x20);
    Orphan<capnp::List<capnp::schema::Annotation,_(capnp::Kind)3>_>::Orphan(__return_storage_ptr__);
  }
  else {
    builder.builder._39_1_ = 0;
    uVar6 = List<capnp::compiler::Declaration::AnnotationApplication,_(capnp::Kind)3>::Reader::size
                      (&annotations);
    Orphanage::newOrphan<capnp::List<capnp::schema::Annotation,(capnp::Kind)3>>
              (__return_storage_ptr__,&this->orphanage,uVar6);
    Orphan<capnp::List<capnp::schema::Annotation,_(capnp::Kind)3>_>::get
              ((BuilderFor<capnp::List<capnp::schema::Annotation,_(capnp::Kind)3>_> *)local_58,
               __return_storage_ptr__);
    for (annotation._reader.nestingLimit = 0;
        uVar6 = List<capnp::compiler::Declaration::AnnotationApplication,_(capnp::Kind)3>::Reader::
                size(&annotations), (uint)annotation._reader.nestingLimit < uVar6;
        annotation._reader.nestingLimit = annotation._reader.nestingLimit + 1) {
      List<capnp::compiler::Declaration::AnnotationApplication,_(capnp::Kind)3>::Reader::operator[]
                ((Reader *)&annotationBuilder._builder.dataSize,&annotations,
                 annotation._reader.nestingLimit);
      List<capnp::schema::Annotation,_(capnp::Kind)3>::Builder::operator[]
                ((Builder *)local_c0,(Builder *)local_58,annotation._reader.nestingLimit);
      capnp::schema::Annotation::Builder::initValue(&local_e8,(Builder *)local_c0);
      capnp::schema::Value::Builder::setVoid(&local_e8);
      Declaration::AnnotationApplication::Reader::getName
                ((Reader *)&decl.field_1.value.source._reader.nestingLimit,
                 (Reader *)&annotationBuilder._builder.dataSize);
      uVar19 = decl.field_1._160_8_;
      noImplicitParams();
      uVar15 = SUB84(name._reader.pointers,0);
      uVar16 = (undefined4)((ulong)name._reader.pointers >> 0x20);
      SVar17 = name._reader.dataSize;
      uVar18 = name._reader._36_4_;
      uVar11 = SUB84(name._reader.capTable,0);
      uVar12 = (undefined4)((ulong)name._reader.capTable >> 0x20);
      uVar13 = SUB84(name._reader.data,0);
      uVar14 = (undefined4)((ulong)name._reader.data >> 0x20);
      source._reader.capTable._0_4_ = (int)name._reader.segment;
      source._reader.segment = (SegmentReader *)uVar19;
      source._reader.capTable._4_4_ = (int)((ulong)name._reader.segment >> 0x20);
      source._reader.data._0_4_ = uVar11;
      source._reader.data._4_4_ = uVar12;
      source._reader.pointers._0_4_ = uVar13;
      source._reader.pointers._4_4_ = uVar14;
      source._reader.dataSize = uVar15;
      source._reader._36_4_ = uVar16;
      source._reader.nestingLimit = SVar17;
      source._reader._44_4_ = uVar18;
      implicitMethodParams.params.reader.segment = (SegmentReader *)uStack_2e8;
      implicitMethodParams.scopeId = _auStack_2f0;
      implicitMethodParams.params.reader.capTable = (CapTableReader *)local_2e0;
      implicitMethodParams.params.reader.ptr = (byte *)uStack_2d8;
      implicitMethodParams.params.reader._24_8_ = local_2d0;
      implicitMethodParams.params.reader._32_8_ = uStack_2c8;
      implicitMethodParams.params.reader._40_8_ = local_2c0;
      uVar19 = _auStack_2f0;
      compileDeclExpression(&local_280,this,source,implicitMethodParams);
      other = kj::_::readMaybe<capnp::compiler::NodeTranslator::BrandedDecl>(&local_280);
      kj::_::NullableValue<capnp::compiler::NodeTranslator::BrandedDecl>::NullableValue
                ((NullableValue<capnp::compiler::NodeTranslator::BrandedDecl> *)local_1d0,other);
      kj::Maybe<capnp::compiler::NodeTranslator::BrandedDecl>::~Maybe(&local_280);
      pBVar7 = kj::_::NullableValue::operator_cast_to_BrandedDecl_((NullableValue *)local_1d0);
      if (pBVar7 != (BrandedDecl *)0x0) {
        kj::_::NullableValue<capnp::compiler::NodeTranslator::BrandedDecl>::operator->
                  ((NullableValue<capnp::compiler::NodeTranslator::BrandedDecl> *)local_1d0);
        BrandedDecl::getKind((BrandedDecl *)local_2f8);
        other_00 = kj::_::readMaybe<capnp::compiler::Declaration::Which>
                             ((Maybe<capnp::compiler::Declaration::Which> *)local_2f8);
        kj::_::NullableValue<capnp::compiler::Declaration::Which>::NullableValue
                  ((NullableValue<capnp::compiler::Declaration::Which> *)(local_2f8 + 4),other_00);
        kj::Maybe<capnp::compiler::Declaration::Which>::~Maybe
                  ((Maybe<capnp::compiler::Declaration::Which> *)local_2f8);
        pWVar8 = kj::_::NullableValue::operator_cast_to_Which_((NullableValue *)(local_2f8 + 4));
        if (pWVar8 == (Which *)0x0) {
          pWVar8 = kj::_::NullableValue<capnp::compiler::Declaration::Which>::operator*
                             ((NullableValue<capnp::compiler::Declaration::Which> *)(local_2f8 + 4))
          ;
          if (*pWVar8 != ANNOTATION) {
            pEVar1 = this->errorReporter;
            name_03._reader.capTable._0_4_ = uVar11;
            name_03._reader.segment = name._reader.segment;
            name_03._reader.capTable._4_4_ = uVar12;
            name_03._reader.data._0_4_ = uVar13;
            name_03._reader.data._4_4_ = uVar14;
            name_03._reader.pointers._0_4_ = uVar15;
            name_03._reader.pointers._4_4_ = uVar16;
            name_03._reader.dataSize = SVar17;
            name_03._reader._36_4_ = uVar18;
            name_03._reader._40_8_ = uVar19;
            expressionString(name_03);
            kj::str<char_const(&)[2],kj::String,char_const(&)[24]>
                      (&local_758,(kj *)0xabe9b4,(char (*) [2])&local_770,
                       (String *)"\' is not an annotation.",(char (*) [24])in_R8);
            kj::StringPtr::StringPtr((StringPtr *)&local_740,&local_758);
            ErrorReporter::addErrorOn<capnp::compiler::Expression::Reader&>
                      (pEVar1,(Reader *)&decl.field_1.value.source._reader.nestingLimit,
                       (StringPtr)local_740);
            kj::String::~String(&local_758);
            kj::String::~String(&local_770);
          }
        }
        else {
          pWVar8 = kj::_::NullableValue<capnp::compiler::Declaration::Which>::operator*
                             ((NullableValue<capnp::compiler::Declaration::Which> *)(local_2f8 + 4))
          ;
          if (*pWVar8 == ANNOTATION) {
            pBVar7 = kj::_::NullableValue<capnp::compiler::NodeTranslator::BrandedDecl>::operator->
                               ((NullableValue<capnp::compiler::NodeTranslator::BrandedDecl> *)
                                local_1d0);
            annotationSchema.field_1 =
                 (anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2)local_c0;
            uVar9 = BrandedDecl::
                    getIdAndFillBrand<capnp::compiler::NodeTranslator::compileAnnotationApplications(capnp::List<capnp::compiler::Declaration::AnnotationApplication,(capnp::Kind)3>::Reader,kj::StringPtr)::__0>
                              (pBVar7,(Type *)&annotationSchema.field_1.value);
            capnp::schema::Annotation::Builder::setId((Builder *)local_c0,uVar9);
            pRVar2 = this->resolver;
            uVar9 = capnp::schema::Annotation::Builder::getId((Builder *)local_c0);
            capnp::schema::Annotation::Builder::getBrand
                      ((Builder *)&node._reader.nestingLimit,(Builder *)local_c0);
            capnp::schema::Brand::Builder::operator_cast_to_Reader
                      (&local_3c0,(Builder *)&node._reader.nestingLimit);
            (*pRVar2->_vptr_Resolver[6])(&local_390,pRVar2,uVar9);
            other_01 = kj::_::readMaybe<capnp::Schema>(&local_390);
            kj::_::NullableValue<capnp::Schema>::NullableValue
                      ((NullableValue<capnp::Schema> *)local_380,other_01);
            kj::Maybe<capnp::Schema>::~Maybe(&local_390);
            pSVar10 = kj::_::NullableValue::operator_cast_to_Schema_((NullableValue *)local_380);
            if (pSVar10 != (Schema *)0x0) {
              pSVar10 = kj::_::NullableValue<capnp::Schema>::operator->
                                  ((NullableValue<capnp::Schema> *)local_380);
              Schema::getProto(&local_448,pSVar10);
              capnp::schema::Node::Reader::getAnnotation((Reader *)local_418,&local_448);
              toDynamic<capnp::schema::Node::Annotation::Reader&>
                        (&local_4c8,(capnp *)local_418,value_00);
              local_4d8 = targetsFlagName.content.ptr;
              sStack_4d0 = targetsFlagName.content.size_;
              DynamicStruct::Reader::get(&local_490,&local_4c8,targetsFlagName);
              RVar3 = DynamicValue::Reader::as<bool>(&local_490);
              DynamicValue::Reader::~Reader(&local_490);
              if (!RVar3) {
                pEVar1 = this->errorReporter;
                value._reader._40_8_ = decl.field_1._160_8_;
                name_01._reader.capTable._0_4_ = uVar11;
                name_01._reader.segment = name._reader.segment;
                name_01._reader.capTable._4_4_ = uVar12;
                name_01._reader.data._0_4_ = uVar13;
                name_01._reader.data._4_4_ = uVar14;
                name_01._reader.pointers._0_4_ = uVar15;
                name_01._reader.pointers._4_4_ = uVar16;
                name_01._reader.dataSize = SVar17;
                name_01._reader._36_4_ = uVar18;
                name_01._reader._40_8_ = uVar19;
                expressionString(name_01);
                kj::str<char_const(&)[2],kj::String,char_const(&)[49]>
                          (&local_500,(kj *)0xabe9b4,(char (*) [2])&local_518,
                           (String *)"\' cannot be applied to this kind of declaration.",in_R8);
                kj::StringPtr::StringPtr((StringPtr *)&local_4e8,&local_500);
                ErrorReporter::addErrorOn<capnp::compiler::Expression::Reader&>
                          (pEVar1,(Reader *)&decl.field_1.value.source._reader.nestingLimit,
                           (StringPtr)local_4e8);
                kj::String::~String(&local_500);
                kj::String::~String(&local_518);
              }
              Declaration::AnnotationApplication::Reader::getValue
                        ((Reader *)local_578,(Reader *)&annotationBuilder._builder.dataSize);
              WVar5 = Declaration::AnnotationApplication::Value::Reader::which((Reader *)local_578);
              if (WVar5 == NONE) {
                capnp::schema::Node::Annotation::Reader::getType(&local_5a8,(Reader *)local_418);
                bVar4 = capnp::schema::Type::Reader::isVoid(&local_5a8);
                if (bVar4) {
                  capnp::schema::Annotation::Builder::getValue(&local_5d0,(Builder *)local_c0);
                  capnp::schema::Value::Builder::setVoid(&local_5d0);
                }
                else {
                  pEVar1 = this->errorReporter;
                  local_648 = decl.field_1._160_8_;
                  name_02._reader.capTable._0_4_ = uVar11;
                  name_02._reader.segment = name._reader.segment;
                  name_02._reader.capTable._4_4_ = uVar12;
                  name_02._reader.data._0_4_ = uVar13;
                  name_02._reader.data._4_4_ = uVar14;
                  name_02._reader.pointers._0_4_ = uVar15;
                  name_02._reader.pointers._4_4_ = uVar16;
                  name_02._reader.dataSize = SVar17;
                  name_02._reader._36_4_ = uVar18;
                  name_02._reader._40_8_ = uVar19;
                  expressionString(name_02);
                  kj::str<char_const(&)[2],kj::String,char_const(&)[20]>
                            (&local_600,(kj *)0xabe9b4,(char (*) [2])&local_618,
                             (String *)"\' requires a value.",(char (*) [20])in_R8);
                  kj::StringPtr::StringPtr((StringPtr *)&local_5e8,&local_600);
                  ErrorReporter::addErrorOn<capnp::compiler::Expression::Reader&>
                            (pEVar1,(Reader *)&decl.field_1.value.source._reader.nestingLimit,
                             (StringPtr)local_5e8);
                  kj::String::~String(&local_600);
                  kj::String::~String(&local_618);
                  capnp::schema::Node::Annotation::Reader::getType(&local_678,(Reader *)local_418);
                  capnp::schema::Annotation::Builder::getValue(&local_6a0,(Builder *)local_c0);
                  type._reader.capTable._0_4_ = (int)local_678._reader.capTable;
                  type._reader.segment = local_678._reader.segment;
                  type._reader.capTable._4_4_ = (int)((ulong)local_678._reader.capTable >> 0x20);
                  type._reader.data._0_4_ = (int)local_678._reader.data;
                  type._reader.data._4_4_ = (int)((ulong)local_678._reader.data >> 0x20);
                  type._reader.pointers._0_4_ = (int)local_678._reader.pointers;
                  type._reader.pointers._4_4_ = (int)((ulong)local_678._reader.pointers >> 0x20);
                  type._reader.dataSize = local_678._reader.dataSize;
                  type._reader._36_4_ = local_678._reader._36_4_;
                  type._reader.nestingLimit = local_678._reader.nestingLimit;
                  type._reader._44_4_ = local_678._reader._44_4_;
                  target._builder.capTable = local_6a0._builder.capTable;
                  target._builder.segment = local_6a0._builder.segment;
                  target._builder.data = local_6a0._builder.data;
                  target._builder.pointers = local_6a0._builder.pointers;
                  target._builder.dataSize = local_6a0._builder.dataSize;
                  target._builder.pointerCount = local_6a0._builder.pointerCount;
                  target._builder._38_2_ = local_6a0._builder._38_2_;
                  compileDefaultDefaultValue(this,type,target);
                }
              }
              else if (WVar5 == EXPRESSION) {
                Declaration::AnnotationApplication::Value::Reader::getExpression
                          (&local_6d0,(Reader *)local_578);
                capnp::schema::Node::Annotation::Reader::getType(&local_700,(Reader *)local_418);
                capnp::schema::Annotation::Builder::getValue(&local_728,(Builder *)local_c0);
                pSVar10 = kj::_::NullableValue<capnp::Schema>::operator*
                                    ((NullableValue<capnp::Schema> *)local_380);
                local_730 = pSVar10->raw;
                source_00._reader.capTable._0_4_ = (int)local_6d0._reader.capTable;
                source_00._reader.segment = local_6d0._reader.segment;
                source_00._reader.capTable._4_4_ = (int)((ulong)local_6d0._reader.capTable >> 0x20);
                source_00._reader.data._0_4_ = (int)local_6d0._reader.data;
                source_00._reader.data._4_4_ = (int)((ulong)local_6d0._reader.data >> 0x20);
                source_00._reader.pointers._0_4_ = (int)local_6d0._reader.pointers;
                source_00._reader.pointers._4_4_ = (int)((ulong)local_6d0._reader.pointers >> 0x20);
                source_00._reader.dataSize = local_6d0._reader.dataSize;
                source_00._reader._36_4_ = local_6d0._reader._36_4_;
                source_00._reader.nestingLimit = local_6d0._reader.nestingLimit;
                source_00._reader._44_4_ = local_6d0._reader._44_4_;
                type_00._reader.capTable = local_700._reader.capTable;
                type_00._reader.segment = local_700._reader.segment;
                type_00._reader.data = local_700._reader.data;
                type_00._reader.pointers = local_700._reader.pointers;
                type_00._reader.dataSize = local_700._reader.dataSize;
                type_00._reader.pointerCount = local_700._reader.pointerCount;
                type_00._reader._38_2_ = local_700._reader._38_2_;
                type_00._reader.nestingLimit = local_700._reader.nestingLimit;
                type_00._reader._44_4_ = local_700._reader._44_4_;
                target_00._builder.capTable = local_728._builder.capTable;
                target_00._builder.segment = local_728._builder.segment;
                target_00._builder.data = local_728._builder.data;
                target_00._builder.pointers = local_728._builder.pointers;
                target_00._builder.dataSize = local_728._builder.dataSize;
                target_00._builder.pointerCount = local_728._builder.pointerCount;
                target_00._builder._38_2_ = local_728._builder._38_2_;
                compileBootstrapValue(this,source_00,type_00,target_00,(Schema)local_730);
              }
            }
            kj::_::NullableValue<capnp::Schema>::~NullableValue
                      ((NullableValue<capnp::Schema> *)local_380);
          }
          else {
            pEVar1 = this->errorReporter;
            name_00._reader.capTable._0_4_ = uVar11;
            name_00._reader.segment = name._reader.segment;
            name_00._reader.capTable._4_4_ = uVar12;
            name_00._reader.data._0_4_ = uVar13;
            name_00._reader.data._4_4_ = uVar14;
            name_00._reader.pointers._0_4_ = uVar15;
            name_00._reader.pointers._4_4_ = uVar16;
            name_00._reader.dataSize = SVar17;
            name_00._reader._36_4_ = uVar18;
            name_00._reader._40_8_ = uVar19;
            expressionString(name_00);
            kj::str<char_const(&)[2],kj::String,char_const(&)[24]>
                      (&local_320,(kj *)0xabe9b4,(char (*) [2])&local_338,
                       (String *)"\' is not an annotation.",(char (*) [24])in_R8);
            kj::StringPtr::StringPtr((StringPtr *)&local_308,&local_320);
            ErrorReporter::addErrorOn<capnp::compiler::Expression::Reader&>
                      (pEVar1,(Reader *)&decl.field_1.value.source._reader.nestingLimit,
                       (StringPtr)local_308);
            kj::String::~String(&local_320);
            kj::String::~String(&local_338);
          }
        }
        kj::_::NullableValue<capnp::compiler::Declaration::Which>::~NullableValue
                  ((NullableValue<capnp::compiler::Declaration::Which> *)(local_2f8 + 4));
      }
      kj::_::NullableValue<capnp::compiler::NodeTranslator::BrandedDecl>::~NullableValue
                ((NullableValue<capnp::compiler::NodeTranslator::BrandedDecl> *)local_1d0);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Orphan<List<schema::Annotation>> NodeTranslator::compileAnnotationApplications(
    List<Declaration::AnnotationApplication>::Reader annotations,
    kj::StringPtr targetsFlagName) {
  if (annotations.size() == 0 || !compileAnnotations) {
    // Return null.
    return Orphan<List<schema::Annotation>>();
  }

  auto result = orphanage.newOrphan<List<schema::Annotation>>(annotations.size());
  auto builder = result.get();

  for (uint i = 0; i < annotations.size(); i++) {
    Declaration::AnnotationApplication::Reader annotation = annotations[i];
    schema::Annotation::Builder annotationBuilder = builder[i];

    // Set the annotation's value to void in case we fail to produce something better below.
    annotationBuilder.initValue().setVoid();

    auto name = annotation.getName();
    KJ_IF_MAYBE(decl, compileDeclExpression(name, noImplicitParams())) {
      KJ_IF_MAYBE(kind, decl->getKind()) {
        if (*kind != Declaration::ANNOTATION) {
          errorReporter.addErrorOn(name, kj::str(
              "'", expressionString(name), "' is not an annotation."));
        } else {
          annotationBuilder.setId(decl->getIdAndFillBrand(
              [&]() { return annotationBuilder.initBrand(); }));
          KJ_IF_MAYBE(annotationSchema,
                      resolver.resolveBootstrapSchema(annotationBuilder.getId(),
                                                      annotationBuilder.getBrand())) {
            auto node = annotationSchema->getProto().getAnnotation();
            if (!toDynamic(node).get(targetsFlagName).as<bool>()) {
              errorReporter.addErrorOn(name, kj::str(
                  "'", expressionString(name), "' cannot be applied to this kind of declaration."));
            }

            // Interpret the value.
            auto value = annotation.getValue();
            switch (value.which()) {
              case Declaration::AnnotationApplication::Value::NONE:
                // No value, i.e. void.
                if (node.getType().isVoid()) {
                  annotationBuilder.getValue().setVoid();
                } else {
                  errorReporter.addErrorOn(name, kj::str(
                      "'", expressionString(name), "' requires a value."));
                  compileDefaultDefaultValue(node.getType(), annotationBuilder.getValue());
                }
                break;

              case Declaration::AnnotationApplication::Value::EXPRESSION:
                compileBootstrapValue(value.getExpression(), node.getType(),
                                      annotationBuilder.getValue(),
                                      *annotationSchema);
                break;
            }
          }
        }
      } else if (*kind != Declaration::ANNOTATION) {
        errorReporter.addErrorOn(name, kj::str(
            "'", expressionString(name), "' is not an annotation."));
      }
    }
  }

  return result;
}